

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O1

int lnextkey(lua_State *L)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  table *tbl;
  ulong uVar3;
  node *pnVar4;
  int in_ESI;
  uint key;
  ulong uVar5;
  size_t sVar6;
  char *str;
  bool bVar7;
  size_t sz;
  size_t local_28;
  
  local_28 = in_RAX;
  tbl = get_table(L,in_ESI);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    if (0 < (long)tbl->sizearray) {
      uVar3 = 1;
      do {
        if (tbl->arraytype[uVar3 - 1] != '\0') goto LAB_00123fb2;
        bVar7 = uVar3 != (long)tbl->sizearray;
        uVar3 = uVar3 + 1;
      } while (bVar7);
    }
LAB_00123efe:
    if (tbl->sizehash == 0) {
      return 0;
    }
    pnVar4 = tbl->hash;
  }
  else {
    iVar2 = lua_type(L,2);
    local_28 = 0;
    if (iVar2 == 3) {
      uVar1 = tbl->sizearray;
      iVar2 = lua_isinteger(L,2);
      if (iVar2 == 0) {
        return 0;
      }
      iVar2 = 0;
      uVar3 = lua_tointegerx(L,2,(int *)0x0);
      key = (uint)uVar3;
      str = (char *)0x0;
      if ((int)key <= (int)uVar1 && 0 < (int)key) {
        if ((ulong)(key & 0x7fffffff) < (ulong)uVar1) {
          uVar5 = (ulong)(key & 0x7fffffff);
          do {
            uVar3 = uVar5 + 1;
            if (tbl->arraytype[uVar5] != '\0') {
LAB_00123fb2:
              lua_pushinteger(L,uVar3);
              return 1;
            }
            uVar5 = uVar3;
          } while (uVar3 != uVar1);
        }
        goto LAB_00123efe;
      }
    }
    else {
      str = luaL_checklstring(L,2,&local_28);
      iVar2 = 1;
      key = 0;
      uVar3 = local_28;
      if (local_28 != 0) {
        sVar6 = local_28;
        do {
          uVar3 = (ulong)((uint)(byte)str[sVar6 - 1] +
                          ((uint)(uVar3 >> 2) & 0x3fffffff) + (uint)uVar3 * 0x20 ^ (uint)uVar3);
          sVar6 = sVar6 + ~(local_28 >> 5);
        } while (local_28 >> 5 < sVar6);
      }
    }
    pnVar4 = lookup_key(tbl,(uint32_t)uVar3,key,iVar2,str,local_28);
    if (pnVar4 == (node *)0x0) {
      return 0;
    }
    pnVar4 = pnVar4 + 1;
    if (tbl->sizehash == (int)((ulong)((long)pnVar4 - (long)tbl->hash) >> 3) * -0x55555555) {
      return 0;
    }
  }
  pushkey(L,tbl->L,pnVar4);
  return 1;
}

Assistant:

static int
lnextkey(lua_State *L) {
	struct table *tbl = get_table(L,1);
	if (lua_isnoneornil(L,2)) {
		if (tbl->sizearray > 0) {
			int i;
			for (i=0;i<tbl->sizearray;i++) {
				if (tbl->arraytype[i] != VALUETYPE_NIL) {
					lua_pushinteger(L, i+1);
					return 1;
				}
			}
		}
		return pushfirsthash(L, tbl);
	}
	int kt = lua_type(L,2);
	uint32_t keyhash;
	int key = 0;
	int keytype;
	size_t sz=0;
	const char *str = NULL;
	int sizearray = tbl->sizearray;
	if (kt == LUA_TNUMBER) {
		if (!lua_isinteger(L, 2)) {
			return 0;
		}
		key = (int)lua_tointeger(L, 2);
		if (key > 0 && key <= sizearray) {
			lua_Integer i;
			for (i=key;i<sizearray;i++) {
				if (tbl->arraytype[i] != VALUETYPE_NIL) {
					lua_pushinteger(L, i+1);
					return 1;
				}
			}
			return pushfirsthash(L, tbl);
		}
		keyhash = (uint32_t)key;
		keytype = KEYTYPE_INTEGER;
	} else {
		str = luaL_checklstring(L, 2, &sz);
		keyhash = calchash(str, sz);
		keytype = KEYTYPE_STRING;
	}

	struct node *n = lookup_key(tbl, keyhash, key, keytype, str, sz);
	if (n) {
		++n;
		int index = n-tbl->hash;
		if (index == tbl->sizehash) {
			return 0;
		}
		pushkey(L, tbl->L, n);
		return 1;
	} else {
		return 0;
	}
}